

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CSceneManager.cpp
# Opt level: O1

ISceneNode * __thiscall
irr::scene::CSceneManager::getSceneNodeFromName(CSceneManager *this,char *name,ISceneNode *start)

{
  int iVar1;
  undefined4 extraout_var;
  long *plVar2;
  undefined4 extraout_var_01;
  list<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_> *plVar3;
  _List_node_base *p_Var4;
  char cVar5;
  optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  startName;
  long *local_48 [2];
  long local_38 [2];
  char local_28;
  undefined4 extraout_var_00;
  
  if (start == (ISceneNode *)0x0) {
    iVar1 = (*(this->super_ISceneManager)._vptr_ISceneManager[9])(this);
    start = (ISceneNode *)CONCAT44(extraout_var,iVar1);
  }
  iVar1 = (*start->_vptr_ISceneNode[5])(start);
  plVar2 = (long *)CONCAT44(extraout_var_00,iVar1);
  local_28 = 0;
  cVar5 = (char)plVar2[4] == '\x01';
  if ((bool)cVar5) {
    local_48[0] = local_38;
    ::std::__cxx11::string::_M_construct<char*>((string *)local_48,*plVar2,plVar2[1] + *plVar2);
    local_28 = cVar5;
    iVar1 = ::std::__cxx11::string::compare((char *)local_48);
    cVar5 = local_28;
    if (iVar1 == 0) goto LAB_001c7be5;
  }
  local_28 = cVar5;
  plVar3 = &start->Children;
  p_Var4 = (_List_node_base *)plVar3;
  do {
    p_Var4 = (((_List_base<irr::scene::ISceneNode_*,_std::allocator<irr::scene::ISceneNode_*>_> *)
              &p_Var4->_M_next)->_M_impl)._M_node.super__List_node_base._M_next;
    if (p_Var4 == (_List_node_base *)plVar3) {
      start = (ISceneNode *)0x0;
      break;
    }
    iVar1 = (*(this->super_ISceneManager)._vptr_ISceneManager[0xb])(this,name,p_Var4[1]._M_next);
    start = (ISceneNode *)CONCAT44(extraout_var_01,iVar1);
  } while (start == (ISceneNode *)0x0);
LAB_001c7be5:
  if ((local_28 == '\x01') && (local_28 = 0, local_48[0] != local_38)) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return start;
}

Assistant:

ISceneNode *CSceneManager::getSceneNodeFromName(const char *name, ISceneNode *start)
{
	if (start == 0)
		start = getRootSceneNode();

	auto startName = start->getName();
	if (startName.has_value() && startName == name)
		return start;

	ISceneNode *node = 0;

	const ISceneNodeList &list = start->getChildren();
	ISceneNodeList::const_iterator it = list.begin();
	for (; it != list.end(); ++it) {
		node = getSceneNodeFromName(name, *it);
		if (node)
			return node;
	}

	return 0;
}